

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

wstring * __thiscall
mjs::(anonymous_namespace)::json_quote_abi_cxx11_
          (wstring *__return_storage_ptr__,_anonymous_namespace_ *this,wstring_view *s)

{
  int iVar1;
  const_iterator pvVar2;
  wchar_t wVar3;
  value_type ch;
  const_iterator __end2;
  const_iterator __begin2;
  wstring_view *__range2;
  wstring_view *s_local;
  wstring *res;
  
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  wVar3 = (wchar_t)__return_storage_ptr__;
  std::__cxx11::wstring::push_back(wVar3);
  __end2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)this);
  pvVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)this);
  for (; __end2 != pvVar2; __end2 = __end2 + 1) {
    iVar1 = *__end2;
    if ((iVar1 == 0x22) || (iVar1 == 0x5c)) {
      std::__cxx11::wstring::push_back(wVar3);
      std::__cxx11::wstring::push_back(wVar3);
    }
    else if (iVar1 < 0x20) {
      std::__cxx11::wstring::push_back(wVar3);
      switch(iVar1) {
      case 8:
        std::__cxx11::wstring::push_back(wVar3);
        break;
      case 9:
        std::__cxx11::wstring::push_back(wVar3);
        break;
      case 10:
        std::__cxx11::wstring::push_back(wVar3);
        break;
      default:
        std::__cxx11::wstring::push_back(wVar3);
        std::__cxx11::wstring::push_back(wVar3);
        std::__cxx11::wstring::push_back(wVar3);
        std::__cxx11::wstring::push_back(wVar3);
        std::__cxx11::wstring::push_back(wVar3);
        break;
      case 0xc:
        std::__cxx11::wstring::push_back(wVar3);
        break;
      case 0xd:
        std::__cxx11::wstring::push_back(wVar3);
      }
    }
    else {
      std::__cxx11::wstring::push_back(wVar3);
    }
  }
  std::__cxx11::wstring::push_back(wVar3);
  return __return_storage_ptr__;
}

Assistant:

std::wstring json_quote(const std::wstring_view& s) {
    std::wstring res;
    res.push_back('"');
    for (const auto ch: s) {
        if (ch == '"' || ch == '\\') {
            res.push_back('\\');
            res.push_back(ch);
        } else if (ch < ' ') {
            res.push_back('\\');
            switch (ch) {
            case  8: res.push_back('b'); break;
            case  9: res.push_back('t'); break;
            case 10: res.push_back('n'); break;
            case 12: res.push_back('f'); break;
            case 13: res.push_back('r'); break;
            default:
                res.push_back('u');
                res.push_back('0');
                res.push_back('0');
                res.push_back((ch&0x10)?'1':'0');
                res.push_back("0123456789abcdef"[ch&0xf]);
            }
        } else {
            res.push_back(ch);
        }
    }
    res.push_back('"');
    return res;
}